

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-xml-cpp.cpp
# Opt level: O2

void test_xml_parse_document_0(void)

{
  bool bVar1;
  uint8_t *buffer;
  size_t length;
  xml_document *document;
  xml_node *node;
  xml_string *pxVar2;
  int in_R8D;
  
  buffer = (uint8_t *)calloc(0x15,1);
  builtin_memcpy(buffer,"<Hello>World</Hello>",0x15);
  length = strlen((char *)buffer);
  document = xml_parse_document(buffer,length);
  _assert_that(document != (xml_document *)0x0,"Could not parse document",
               "test_xml_parse_document_0",(char *)0x5d,in_R8D);
  node = xml_document_root(document);
  pxVar2 = xml_node_name(node);
  bVar1 = string_equals(pxVar2,"Hello");
  _assert_that(bVar1,"root node name must be `Hello\'","test_xml_parse_document_0",(char *)0x60,
               in_R8D);
  pxVar2 = xml_node_content(node);
  bVar1 = string_equals(pxVar2,"World");
  _assert_that(bVar1,"root node content must be `World\'","test_xml_parse_document_0",(char *)0x62,
               in_R8D);
  xml_document_free(document,true);
  return;
}

Assistant:

static void test_xml_parse_document_0() {
	SOURCE(source, "<Hello>World</Hello>");
  // uint8_t* source = malloc((1 + strlen("<Hello>World</Hello>")) *
  //   sizeof(uint8_t));
  // {
  //   const char* content_string = "<Hello>World</Hello>";
  //   memcpy(source, content_string, strlen("<Hello>World</Hello>") + 1);
  // }
	struct xml_document* document = xml_parse_document(source,
	  strlen((const char *)source));
	assert_that(document, "Could not parse document");
	struct xml_node* root = xml_document_root(document);
	assert_that(string_equals(xml_node_name(root), "Hello"),
	  "root node name must be `Hello'");
	assert_that(string_equals(xml_node_content(root), "World"),
	  "root node content must be `World'");
	xml_document_free(document, true);
}